

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
* __thiscall
wallet::LegacyScriptPubKeyMan::GetReservedDestination
          (LegacyScriptPubKeyMan *this,OutputType type,bool internal,int64_t *index,
          CKeyPool *keypool)

{
  byte bVar1;
  undefined1 uVar2;
  size_type sVar3;
  byte in_CL;
  int in_EDX;
  long *in_RSI;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffe48;
  undefined6 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe56;
  undefined1 in_stack_fffffffffffffe57;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *in_stack_fffffffffffffe58;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *this_00;
  char *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  OutputType in_stack_fffffffffffffe84;
  CPubKey *in_stack_fffffffffffffe88;
  ConstevalStringLiteral in_stack_fffffffffffffe98;
  undefined1 in_stack_ffffffffffffff37;
  CKeyPool *in_stack_ffffffffffffff38;
  int64_t *in_stack_ffffffffffffff40;
  LegacyScriptPubKeyMan *in_stack_ffffffffffffff48;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = std::
          unordered_set<OutputType,_std::hash<OutputType>,_std::equal_to<OutputType>,_std::allocator<OutputType>_>
          ::count((unordered_set<OutputType,_std::hash<OutputType>,_std::equal_to<OutputType>,_std::allocator<OutputType>_>
                   *)in_stack_fffffffffffffe58,
                  (key_type *)
                  CONCAT17(in_stack_fffffffffffffe57,
                           CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)));
  if (sVar3 == 0) {
    this_00 = (Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
               *)&stack0xffffffffffffffb8;
    ::_(in_stack_fffffffffffffe98);
    util::
    Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
    ::Result(this_00,(Error *)CONCAT17(in_stack_fffffffffffffe57,
                                       CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)
                                      ));
    util::Error::~Error((Error *)in_stack_fffffffffffffe48);
  }
  else {
    if (in_EDX == 3) {
      __assert_fail("type != OutputType::BECH32M",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                    ,0x136,
                    "virtual util::Result<CTxDestination> wallet::LegacyScriptPubKeyMan::GetReservedDestination(const OutputType, bool, int64_t &, CKeyPool &)"
                   );
    }
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe48);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe88,
               (AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78,(char *)in_RSI,(int)((ulong)in_RDI >> 0x20),
               SUB81((ulong)in_RDI >> 0x18,0));
    bVar1 = (**(code **)(*in_RSI + 0x68))(in_RSI,in_CL & 1);
    if ((bVar1 & 1) == 0) {
      ::_(in_stack_fffffffffffffe98);
      util::
      Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
      ::Result(in_stack_fffffffffffffe58,
               (Error *)CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)
                                ));
      util::Error::~Error((Error *)in_stack_fffffffffffffe48);
    }
    else {
      (**(code **)(*in_RSI + 0x48))(in_RSI,0);
      uVar2 = ReserveKeyFromKeyPool
                        (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff38,(bool)in_stack_ffffffffffffff37);
      if ((bool)uVar2) {
        GetDestinationForKey(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
        util::
        Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
        ::Result(in_stack_fffffffffffffe58,
                 (T *)CONCAT17(bVar1,CONCAT16(uVar2,in_stack_fffffffffffffe50)));
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~variant(in_stack_fffffffffffffe48);
      }
      else {
        ::_(in_stack_fffffffffffffe98);
        util::
        Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
        ::Result(in_stack_fffffffffffffe58,
                 (Error *)CONCAT17(bVar1,CONCAT16(uVar2,in_stack_fffffffffffffe50)));
        util::Error::~Error((Error *)in_stack_fffffffffffffe48);
      }
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<CTxDestination> LegacyScriptPubKeyMan::GetReservedDestination(const OutputType type, bool internal, int64_t& index, CKeyPool& keypool)
{
    if (LEGACY_OUTPUT_TYPES.count(type) == 0) {
        return util::Error{_("Error: Legacy wallets only support the \"legacy\", \"p2sh-segwit\", and \"bech32\" address types")};
    }
    assert(type != OutputType::BECH32M);

    LOCK(cs_KeyStore);
    if (!CanGetAddresses(internal)) {
        return util::Error{_("Error: Keypool ran out, please call keypoolrefill first")};
    }

    // Fill-up keypool if needed
    TopUp();

    if (!ReserveKeyFromKeyPool(index, keypool, internal)) {
        return util::Error{_("Error: Keypool ran out, please call keypoolrefill first")};
    }
    return GetDestinationForKey(keypool.vchPubKey, type);
}